

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O2

void __thiscall deqp::gles3::Performance::anon_unknown_0::BaseCase::~BaseCase(BaseCase *this)

{
  (this->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_01e43130;
  tcu::ResultCollector::~ResultCollector(&this->m_results);
  tcu::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

virtual					~BaseCase			(void) {}